

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsParser.cxx
# Opt level: O2

size_t __thiscall
kws::Parser::FindConstructor
          (Parser *this,string *buffer,string *className,bool headerfile,size_t startPos)

{
  bool bVar1;
  bool bVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  ulong local_98;
  string localconstructor;
  string constructor;
  string local_50 [32];
  
  std::__cxx11::string::string((string *)&constructor,"",(allocator *)&localconstructor);
  std::__cxx11::string::assign((char *)&constructor);
  std::__cxx11::string::append((string *)&constructor);
  lVar3 = std::__cxx11::string::find((char *)buffer,(ulong)constructor._M_dataplus._M_p);
  lVar4 = std::__cxx11::string::find((char *)buffer,0x161d52);
  lVar5 = std::__cxx11::string::find((char *)buffer,0x1549a1);
  while (((lVar5 != -1 && (lVar4 != -1)) && (lVar3 != -1))) {
    std::__cxx11::string::substr((ulong)&localconstructor,(ulong)buffer);
    lVar3 = localconstructor._M_string_length + 1;
    bVar2 = true;
    do {
      bVar1 = bVar2;
      lVar3 = lVar3 + -1;
      bVar2 = false;
    } while (lVar3 != 0);
    if (bVar1) {
      std::__cxx11::string::substr((ulong)local_50,(ulong)buffer);
      std::__cxx11::string::operator=((string *)&localconstructor,local_50);
      std::__cxx11::string::~string(local_50);
      lVar3 = localconstructor._M_string_length + 1;
      bVar2 = true;
      do {
        bVar1 = bVar2;
        lVar3 = lVar3 + -1;
        bVar2 = false;
      } while (lVar3 != 0);
      if (bVar1) {
        uVar6 = std::__cxx11::string::find((char *)buffer,0x161d46);
        local_98 = std::__cxx11::string::find((char *)buffer,0x154cbe);
        if (uVar6 <= local_98) {
          local_98 = 0xffffffffffffffff;
        }
        bVar2 = true;
      }
      else {
        bVar2 = false;
      }
    }
    else {
      bVar2 = false;
    }
    std::__cxx11::string::~string((string *)&localconstructor);
    if (bVar2) goto LAB_0011e4c2;
    std::__cxx11::string::string((string *)&localconstructor,"",(allocator *)local_50);
    std::__cxx11::string::assign((char *)&localconstructor);
    std::__cxx11::string::append((string *)&localconstructor);
    lVar3 = std::__cxx11::string::find((char *)buffer,(ulong)localconstructor._M_dataplus._M_p);
    lVar4 = std::__cxx11::string::find((char *)buffer,0x161d52);
    lVar5 = std::__cxx11::string::find((char *)buffer,0x1549a1);
    std::__cxx11::string::~string((string *)&localconstructor);
  }
  local_98 = 0xffffffffffffffff;
LAB_0011e4c2:
  std::__cxx11::string::~string((string *)&constructor);
  return local_98;
}

Assistant:

size_t Parser::FindConstructor(const std::string & buffer, const std::string & className,
                               bool headerfile, size_t startPos) const
{
  std::string constructor = "";

  if(headerfile)
    {
    constructor = " ";
    }
  else
    {
    constructor = ":";
    }
  constructor += className;
  size_t pos = buffer.find(constructor.c_str(),startPos);
  size_t pos2 = buffer.find("(",pos);
  size_t pos3 = buffer.find(")",pos2);

  // if it's not the destructor ...
  /*std::string dest = "~";
  dest += className;
  long destructor = buffer.find(dest.c_str(),0);*/
  while(pos != std::string::npos && pos2 != std::string::npos && pos3 != std::string::npos)
    {
    //if(pos != destructor+1) // we have the constructor
      {
      // we look if we have only spaces or \n between pos pos2 and pos3
      std::string val = buffer.substr(pos+className.size()+1,pos2-pos-className.size()-1);
      bool ok = true;
      for (char i : val) {
        if (i != ' ' || i != '\n') {
          ok =false;
        }
      }

      bool ok2 = false;
      if(ok)
        {
        ok2 = true;
        val = buffer.substr(pos2+1,pos3-pos2-1);
        for (char i : val) {
          if (i != ' ' || i != '\n') {
            ok2 =false;
          }
        }
        }

      // if ok2 then we check if the constructor is implemented
      if(ok2)
        {
        size_t pos4 = buffer.find(";",pos3);
        size_t pos5 = buffer.find("{",pos3);

        if(pos5<pos4)
          {
          return pos5;
          }
	return std::string::npos;
        }
      }
    std::string localconstructor = "";
    if(headerfile)
      {
      localconstructor = " ";
      }
    else
      {
      localconstructor = ":";
      }
    localconstructor += className;
    pos = buffer.find(localconstructor.c_str(),pos+1);
    pos2 = buffer.find("(",pos);
    pos3 = buffer.find(")",pos2);
    }

  return std::string::npos;
}